

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_object.cpp
# Opt level: O1

void Object::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  int iVar4;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  void *local_8;
  
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == noArgSignal && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == oneArgSignal && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == twoArgsSignal && lVar3 == 0) {
      *puVar1 = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      local_8 = _a[2];
      local_1c = *_a[1];
      local_10 = &local_1c;
      iVar4 = 2;
    }
    else {
      if (_id != 1) {
        if (_id != 0) {
          return;
        }
        QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
        return;
      }
      local_10 = (undefined4 *)_a[1];
      iVar4 = 1;
    }
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_18);
  }
  return;
}

Assistant:

void Object::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Object *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->noArgSignal(); break;
        case 1: _t->oneArgSignal((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->twoArgsSignal((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Object::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Object::noArgSignal)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Object::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Object::oneArgSignal)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (Object::*)(int , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Object::twoArgsSignal)) {
                *result = 2;
                return;
            }
        }
    }
}